

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O2

void __thiscall QtMWidgets::MsgBoxTitlePrivate::prepareTitle(MsgBoxTitlePrivate *this)

{
  qsizetype qVar1;
  QRect QVar2;
  int iVar3;
  int extraout_EDX;
  QLatin1String QVar4;
  undefined1 local_68 [16];
  qsizetype local_58;
  QRect r;
  QMargins local_40;
  
  local_68 = (undefined1  [16])QWidget::rect(&this->q->super_QWidget);
  local_40.m_left = this->margin;
  local_40.m_top = 0;
  local_40.m_bottom = 0;
  local_40.m_right = local_40.m_left;
  r = QRect::marginsRemoved((QRect *)local_68,&local_40);
  QWidget::fontMetrics((QWidget *)local_68);
  iVar3 = QFontMetrics::boundingRect
                    ((QRect *)local_68,(int)&r,(QString *)0x1,(int)&this->title,(int *)0x0);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_68);
  QString::operator=(&this->preparedTitle,&this->title);
  if ((r.x2 - r.x1) + 1 < (extraout_EDX - iVar3) + 1) {
    QWidget::fontMetrics((QWidget *)local_68);
    QFontMetrics::averageCharWidth();
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_68);
    QString::left((longlong)local_68);
    QVar2 = *(QRect *)&(this->preparedTitle).d;
    (this->preparedTitle).d.d = (Data *)local_68._0_8_;
    (this->preparedTitle).d.ptr = (char16_t *)local_68._8_8_;
    qVar1 = (this->preparedTitle).d.size;
    (this->preparedTitle).d.size = local_58;
    local_68 = (undefined1  [16])QVar2;
    local_58 = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QVar4.m_data = (char *)0x3;
    QVar4.m_size = (qsizetype)&this->preparedTitle;
    QString::append(QVar4);
  }
  return;
}

Assistant:

void
MsgBoxTitlePrivate::prepareTitle()
{
	const QRect r = q->rect().marginsRemoved( QMargins( margin, 0,
		margin, 0 ) );

	const QRect & b = q->fontMetrics().boundingRect( r,
		Qt::AlignLeft, title );

	preparedTitle = title;

	if( b.width() > r.width() )
	{
		const int averageCount = r.width() / q->fontMetrics().averageCharWidth();

		preparedTitle = title.left( averageCount - 3 );
		preparedTitle.append( QLatin1String( "..." ) );
	}
}